

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzer.cpp
# Opt level: O2

void __thiscall SimpleParallelAnalyzer::SimpleParallelAnalyzer(SimpleParallelAnalyzer *this)

{
  SimpleParallelAnalyzerSettings *this_00;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__SimpleParallelAnalyzer_0010cca8;
  this->mLastFrameWidth = -1;
  this_00 = (SimpleParallelAnalyzerSettings *)operator_new(0x68);
  SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings(this_00);
  (this->mSettings)._M_t.
  super___uniq_ptr_impl<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
  ._M_t.
  super__Tuple_impl<0UL,_SimpleParallelAnalyzerSettings_*,_std::default_delete<SimpleParallelAnalyzerSettings>_>
  .super__Head_base<0UL,_SimpleParallelAnalyzerSettings_*,_false>._M_head_impl = this_00;
  (this->mResults)._M_t.
  super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
  ._M_t.
  super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
  .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl =
       (SimpleParallelAnalyzerResults *)0x0;
  (this->mData).super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mData).super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mData).super__Vector_base<AnalyzerChannelData_*,_std::allocator<AnalyzerChannelData_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SimpleParallelSimulationDataGenerator::SimpleParallelSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  Analyzer::UseFrameV2();
  return;
}

Assistant:

SimpleParallelAnalyzer::SimpleParallelAnalyzer()
    : Analyzer2(), mSettings( new SimpleParallelAnalyzerSettings() ), mSimulationInitilized( false )
{
    SetAnalyzerSettings( mSettings.get() );
    UseFrameV2();
}